

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_long>
          (BasicWriter<char> *this,unsigned_long value,uint prefix_size)

{
  uint uVar1;
  CharPtr p;
  char *buffer;
  undefined4 in_EDX;
  BasicWriter<char> *in_RSI;
  unsigned_long in_RDI;
  char *ptr;
  uint num_digits;
  uint64_t in_stack_ffffffffffffffe0;
  
  uVar1 = internal::count_digits(in_stack_ffffffffffffffe0);
  p = grow_buffer(in_RSI,CONCAT44(in_EDX,uVar1));
  buffer = get(p);
  internal::format_decimal<unsigned_long,char>(buffer,in_RDI,0);
  return buffer;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }